

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O0

int vrna_params_load_from_string(char *string,char *name,uint options)

{
  char *pcVar1;
  size_t local_58;
  size_t lines_mem;
  size_t lines;
  char *rest;
  char *token;
  char *tmp_string;
  char **ptr;
  char **params_array;
  int ret;
  uint options_local;
  char *name_local;
  char *string_local;
  
  params_array._0_4_ = 0;
  if (string != (char *)0x0) {
    local_58 = 0;
    lines_mem = 0;
    ptr = (char **)0x0;
    params_array._4_4_ = options;
    _ret = name;
    name_local = string;
    token = strdup(string);
    rest = strtok_r(token,"\n",(char **)&lines);
    while (rest != (char *)0x0) {
      if (lines_mem == local_58) {
        local_58 = local_58 + 0x8000;
        ptr = (char **)vrna_realloc(ptr,(int)local_58 * 8);
      }
      pcVar1 = strdup(rest);
      ptr[lines_mem] = pcVar1;
      rest = strtok_r((char *)0x0,"\n",(char **)&lines);
      lines_mem = lines_mem + 1;
    }
    ptr = (char **)vrna_realloc(ptr,((int)lines_mem + 1) * 8);
    ptr[lines_mem] = (char *)0x0;
    params_array._0_4_ = set_parameters_from_string(ptr,_ret);
    free(token);
    for (tmp_string = (char *)ptr; *(long *)tmp_string != 0; tmp_string = tmp_string + 8) {
      free(*(void **)tmp_string);
    }
    free(ptr);
  }
  return (int)params_array;
}

Assistant:

PUBLIC int
vrna_params_load_from_string(const char   *string,
                             const char   *name,
                             unsigned int options)
{
  int ret = 0;

  if (string) {
    char    **params_array, **ptr, *tmp_string, *token, *rest;
    size_t  lines, lines_mem;

    lines         = lines_mem = 0;
    params_array  = NULL;

    /* convert string into array of lines */
    tmp_string = strdup(string);

    token = strtok_r(tmp_string, "\n", &rest);

    while (token != NULL) {
      if (lines == lines_mem) {
        lines_mem     += 32768;
        params_array  = (char **)vrna_realloc(params_array, sizeof(char *) * lines_mem);
      }

      params_array[lines++] = strdup(token);

      token = strtok_r(NULL, "\n", &rest);
    }

    /* reallocate to actual requirements */
    params_array        = (char **)vrna_realloc(params_array, sizeof(char *) * (lines + 1));
    params_array[lines] = NULL;

    /* actually apply parameters */
    ret = set_parameters_from_string(params_array,
                                     name);

    /* cleanup memory */
    free(tmp_string);

    for (ptr = params_array; *ptr != NULL; ptr++)
      free(*ptr);

    free(params_array);
  }

  return ret;
}